

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateEqualsAndHashCode
          (ImmutableMessageGenerator *this,Printer *printer)

{
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *this_00;
  _Rb_tree_header *p_Var1;
  Descriptor *pDVar2;
  OneofDescriptor *pOVar3;
  long lVar4;
  bool bVar5;
  FieldGeneratorInfo *pFVar6;
  ImmutableFieldGenerator *pIVar7;
  OneofGeneratorInfo *pOVar8;
  _Rb_tree_node_base *p_Var9;
  AlphaNum *a;
  AlphaNum *a_00;
  int j_1;
  FieldDescriptor *pFVar10;
  char *text;
  int j;
  long lVar11;
  int i;
  long lVar12;
  string local_80;
  AlphaNum local_60;
  
  io::Printer::Print<>(printer,"@java.lang.Override\npublic boolean equals(");
  io::Printer::Print<>(printer,"final java.lang.Object obj) {\n");
  io::Printer::Indent(printer);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&local_60,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "if (obj == this) {\n return true;\n}\nif (!(obj instanceof $classname$)) {\n  return super.equals(obj);\n}\n$classname$ other = ($classname$) obj;\n\n"
             ,(char (*) [10])0x3dd2a7,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  this_00 = &this->field_generators_;
  lVar11 = 0;
  for (lVar12 = 0; pDVar2 = (this->super_MessageGenerator).descriptor_,
      lVar12 < *(int *)(pDVar2 + 4); lVar12 = lVar12 + 1) {
    pFVar10 = (FieldDescriptor *)(*(long *)(pDVar2 + 0x28) + lVar11);
    bVar5 = IsRealOneof(pFVar10);
    if (!bVar5) {
      pFVar6 = Context::GetFieldGeneratorInfo(this->context_,pFVar10);
      bVar5 = anon_unknown_27::CheckHasBitsForEqualsAndHashCode(pFVar10);
      if (bVar5) {
        io::Printer::Print<char[5],std::__cxx11::string>
                  (printer,
                   "if (has$name$() != other.has$name$()) return false;\nif (has$name$()) {\n",
                   (char (*) [5])0x3de831,&pFVar6->capitalized_name);
        io::Printer::Indent(printer);
        pIVar7 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                           (this_00,pFVar10);
        (*pIVar7->_vptr_ImmutableFieldGenerator[0x12])(pIVar7,printer);
        io::Printer::Outdent(printer);
        io::Printer::Print<>(printer,"}\n");
      }
      else {
        pIVar7 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                           (this_00,pFVar10);
        (*pIVar7->_vptr_ImmutableFieldGenerator[0x12])(pIVar7,printer);
      }
    }
    lVar11 = lVar11 + 0x48;
  }
  p_Var1 = &(this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header;
  for (p_Var9 = (this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left; (_Rb_tree_header *)p_Var9 != p_Var1;
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
    pOVar3 = *(OneofDescriptor **)(p_Var9 + 1);
    pOVar8 = Context::GetOneofGeneratorInfo(this->context_,pOVar3);
    io::Printer::Print<char[23],std::__cxx11::string>
              (printer,
               "if (!get$oneof_capitalized_name$Case().equals(other.get$oneof_capitalized_name$Case())) return false;\n"
               ,(char (*) [23])"oneof_capitalized_name",&pOVar8->capitalized_name);
    pOVar8 = Context::GetOneofGeneratorInfo(this->context_,pOVar3);
    io::Printer::Print<char[11],std::__cxx11::string>
              (printer,"switch ($oneof_name$Case_) {\n",(char (*) [11])0x3e5415,&pOVar8->name);
    io::Printer::Indent(printer);
    lVar12 = 0;
    for (lVar11 = 0; lVar11 < *(int *)(pOVar3 + 4); lVar11 = lVar11 + 1) {
      lVar4 = *(long *)(pOVar3 + 0x20);
      strings::AlphaNum::AlphaNum(&local_60,*(int *)(lVar4 + 4 + lVar12));
      StrCat_abi_cxx11_(&local_80,(protobuf *)&local_60,a);
      io::Printer::Print<char[13],std::__cxx11::string>
                (printer,"case $field_number$:\n",(char (*) [13])"field_number",&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      io::Printer::Indent(printer);
      pIVar7 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (this_00,(FieldDescriptor *)(lVar4 + lVar12));
      (*pIVar7->_vptr_ImmutableFieldGenerator[0x12])(pIVar7,printer);
      io::Printer::Print<>(printer,"break;\n");
      io::Printer::Outdent(printer);
      lVar12 = lVar12 + 0x48;
    }
    io::Printer::Print<>(printer,"case 0:\ndefault:\n");
    io::Printer::Outdent(printer);
    io::Printer::Print<>(printer,"}\n");
  }
  io::Printer::Print<>(printer,"if (!unknownFields.equals(other.unknownFields)) return false;\n");
  if (0 < *(int *)((this->super_MessageGenerator).descriptor_ + 0x78)) {
    io::Printer::Print<>
              (printer,
               "if (!getExtensionFields().equals(other.getExtensionFields()))\n  return false;\n");
  }
  io::Printer::Print<>(printer,"return true;\n");
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n\n");
  io::Printer::Print<>(printer,"@java.lang.Override\npublic int hashCode() {\n");
  io::Printer::Indent(printer);
  io::Printer::Print<>(printer,"if (memoizedHashCode != 0) {\n");
  io::Printer::Indent(printer);
  io::Printer::Print<>(printer,"return memoizedHashCode;\n");
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\nint hash = 41;\n");
  text = "hash = (19 * hash) + getDescriptor().hashCode();\n";
  if (*(char *)(*(long *)((this->super_MessageGenerator).descriptor_ + 0x20) + 0x49) != '\0') {
    text = "hash = (19 * hash) + getDescriptorForType().hashCode();\n";
  }
  io::Printer::Print<>(printer,text);
  lVar11 = 0;
  for (lVar12 = 0; pDVar2 = (this->super_MessageGenerator).descriptor_,
      lVar12 < *(int *)(pDVar2 + 4); lVar12 = lVar12 + 1) {
    pFVar10 = (FieldDescriptor *)(*(long *)(pDVar2 + 0x28) + lVar11);
    bVar5 = IsRealOneof(pFVar10);
    if (!bVar5) {
      pFVar6 = Context::GetFieldGeneratorInfo(this->context_,pFVar10);
      bVar5 = anon_unknown_27::CheckHasBitsForEqualsAndHashCode(pFVar10);
      if (bVar5) {
        io::Printer::Print<char[5],std::__cxx11::string>
                  (printer,"if (has$name$()) {\n",(char (*) [5])0x3de831,&pFVar6->capitalized_name);
        io::Printer::Indent(printer);
        pIVar7 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                           (this_00,pFVar10);
        (*pIVar7->_vptr_ImmutableFieldGenerator[0x13])(pIVar7,printer);
        io::Printer::Outdent(printer);
        io::Printer::Print<>(printer,"}\n");
      }
      else {
        pIVar7 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                           (this_00,pFVar10);
        (*pIVar7->_vptr_ImmutableFieldGenerator[0x13])(pIVar7,printer);
      }
    }
    lVar11 = lVar11 + 0x48;
  }
  for (p_Var9 = (this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left; (_Rb_tree_header *)p_Var9 != p_Var1;
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
    pOVar3 = *(OneofDescriptor **)(p_Var9 + 1);
    pOVar8 = Context::GetOneofGeneratorInfo(this->context_,pOVar3);
    io::Printer::Print<char[11],std::__cxx11::string>
              (printer,"switch ($oneof_name$Case_) {\n",(char (*) [11])0x3e5415,&pOVar8->name);
    io::Printer::Indent(printer);
    lVar12 = 0;
    for (lVar11 = 0; lVar11 < *(int *)(pOVar3 + 4); lVar11 = lVar11 + 1) {
      lVar4 = *(long *)(pOVar3 + 0x20);
      strings::AlphaNum::AlphaNum(&local_60,*(int *)(lVar4 + 4 + lVar12));
      StrCat_abi_cxx11_(&local_80,(protobuf *)&local_60,a_00);
      io::Printer::Print<char[13],std::__cxx11::string>
                (printer,"case $field_number$:\n",(char (*) [13])"field_number",&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      io::Printer::Indent(printer);
      pIVar7 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (this_00,(FieldDescriptor *)(lVar4 + lVar12));
      (*pIVar7->_vptr_ImmutableFieldGenerator[0x13])(pIVar7,printer);
      io::Printer::Print<>(printer,"break;\n");
      io::Printer::Outdent(printer);
      lVar12 = lVar12 + 0x48;
    }
    io::Printer::Print<>(printer,"case 0:\ndefault:\n");
    io::Printer::Outdent(printer);
    io::Printer::Print<>(printer,"}\n");
  }
  if (0 < *(int *)((this->super_MessageGenerator).descriptor_ + 0x78)) {
    io::Printer::Print<>(printer,"hash = hashFields(hash, getExtensionFields());\n");
  }
  io::Printer::Print<>(printer,"hash = (29 * hash) + unknownFields.hashCode();\n");
  io::Printer::Print<>(printer,"memoizedHashCode = hash;\nreturn hash;\n");
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n\n");
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateEqualsAndHashCode(
    io::Printer* printer) {
  printer->Print(
      "@java.lang.Override\n"
      "public boolean equals(");
  printer->Print("final java.lang.Object obj) {\n");
  printer->Indent();
  printer->Print(
      "if (obj == this) {\n"
      " return true;\n"
      "}\n"
      "if (!(obj instanceof $classname$)) {\n"
      "  return super.equals(obj);\n"
      "}\n"
      "$classname$ other = ($classname$) obj;\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (!IsRealOneof(field)) {
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      bool check_has_bits = CheckHasBitsForEqualsAndHashCode(field);
      if (check_has_bits) {
        printer->Print(
            "if (has$name$() != other.has$name$()) return false;\n"
            "if (has$name$()) {\n",
            "name", info->capitalized_name);
        printer->Indent();
      }
      field_generators_.get(field).GenerateEqualsCode(printer);
      if (check_has_bits) {
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  // Compare oneofs.
  for (auto oneof : oneofs_) {
    printer->Print(
        "if (!get$oneof_capitalized_name$Case().equals("
        "other.get$oneof_capitalized_name$Case())) return false;\n",
        "oneof_capitalized_name",
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name);
    printer->Print("switch ($oneof_name$Case_) {\n", "oneof_name",
                   context_->GetOneofGeneratorInfo(oneof)->name);
    printer->Indent();
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("case $field_number$:\n", "field_number",
                     StrCat(field->number()));
      printer->Indent();
      field_generators_.get(field).GenerateEqualsCode(printer);
      printer->Print("break;\n");
      printer->Outdent();
    }
    printer->Print(
        "case 0:\n"
        "default:\n");
    printer->Outdent();
    printer->Print("}\n");
  }

  // Always consider unknown fields for equality. This will sometimes return
  // false for non-canonical ordering when running in LITE_RUNTIME but it's
  // the best we can do.
  printer->Print(
      "if (!unknownFields.equals(other.unknownFields)) return false;\n");
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        "if (!getExtensionFields().equals(other.getExtensionFields()))\n"
        "  return false;\n");
  }
  printer->Print("return true;\n");
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");

  printer->Print(
      "@java.lang.Override\n"
      "public int hashCode() {\n");
  printer->Indent();
  printer->Print("if (memoizedHashCode != 0) {\n");
  printer->Indent();
  printer->Print("return memoizedHashCode;\n");
  printer->Outdent();
  printer->Print(
      "}\n"
      "int hash = 41;\n");

  // If we output a getDescriptor() method, use that as it is more efficient.
  if (descriptor_->options().no_standard_descriptor_accessor()) {
    printer->Print("hash = (19 * hash) + getDescriptorForType().hashCode();\n");
  } else {
    printer->Print("hash = (19 * hash) + getDescriptor().hashCode();\n");
  }

  // hashCode non-oneofs.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (!IsRealOneof(field)) {
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      bool check_has_bits = CheckHasBitsForEqualsAndHashCode(field);
      if (check_has_bits) {
        printer->Print("if (has$name$()) {\n", "name", info->capitalized_name);
        printer->Indent();
      }
      field_generators_.get(field).GenerateHashCode(printer);
      if (check_has_bits) {
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  // hashCode oneofs.
  for (auto oneof : oneofs_) {
    printer->Print("switch ($oneof_name$Case_) {\n", "oneof_name",
                   context_->GetOneofGeneratorInfo(oneof)->name);
    printer->Indent();
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("case $field_number$:\n", "field_number",
                     StrCat(field->number()));
      printer->Indent();
      field_generators_.get(field).GenerateHashCode(printer);
      printer->Print("break;\n");
      printer->Outdent();
    }
    printer->Print(
        "case 0:\n"
        "default:\n");
    printer->Outdent();
    printer->Print("}\n");
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print("hash = hashFields(hash, getExtensionFields());\n");
  }

  printer->Print("hash = (29 * hash) + unknownFields.hashCode();\n");
  printer->Print(
      "memoizedHashCode = hash;\n"
      "return hash;\n");
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");
}